

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O1

int GetSystemCPUsCount(void)

{
  int iVar1;
  long lVar2;
  
  lVar2 = sysconf(0x54);
  iVar1 = (int)lVar2;
  if (lVar2 < 0) {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int GetSystemCPUsCount()
{
#if defined(PLATFORM_WINDOWS)
  // Get the number of processors.
  SYSTEM_INFO info;
  GetSystemInfo(&info);
  return  info.dwNumberOfProcessors;
#else
  long rv = sysconf(_SC_NPROCESSORS_ONLN);
  if (rv < 0) {
    return 1;
  }
  return static_cast<int>(rv);
#endif
}